

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O0

Indices * __thiscall jhu::thrax::Span::indices(Indices *__return_storage_ptr__,Span *this)

{
  int iVar1;
  iterator __first;
  iterator __last;
  allocator<short> local_1a;
  undefined1 local_19;
  Span *local_18;
  Span *this_local;
  Indices *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Span *)__return_storage_ptr__;
  iVar1 = size(this);
  std::allocator<short>::allocator(&local_1a);
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,(long)iVar1,&local_1a);
  std::allocator<short>::~allocator(&local_1a);
  __first = std::vector<short,_std::allocator<short>_>::begin(__return_storage_ptr__);
  __last = std::vector<short,_std::allocator<short>_>::end(__return_storage_ptr__);
  std::iota<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,short>
            ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
             __first._M_current,
             (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
             __last._M_current,this->start);
  return __return_storage_ptr__;
}

Assistant:

auto indices() const {
    Indices result(size());
    std::iota(result.begin(), result.end(), start);
    return result;
  }